

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereCheckIfBloomFilterIsUseful(WhereInfo *pWInfo)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  SrcList *pSVar4;
  long lVar5;
  Table *pTVar6;
  long lVar7;
  short sVar8;
  bool bVar9;
  
  bVar1 = pWInfo->nLevel;
  if ((ulong)bVar1 != 0) {
    pSVar4 = pWInfo->pTabList;
    sVar8 = 0;
    lVar7 = 0;
    do {
      lVar5 = *(long *)((long)&pWInfo->a[0].pWLoop + lVar7);
      pTVar6 = pSVar4->a[*(byte *)(lVar5 + 0x10)].pSTab;
      uVar2 = pTVar6->tabFlags;
      if ((uVar2 & 0x10) != 0) {
        pTVar6->tabFlags = uVar2 | 0x100;
        if (((lVar7 != 0) &&
            (uVar3 = *(uint *)(lVar5 + 0x30), (uVar3 & 0x300) != 0 && (~uVar3 & 0x800001) == 0)) &&
           (pTVar6->nRowLogEst < sVar8)) {
          *(uint *)(lVar5 + 0x30) = uVar3 & 0xffbfffbf | 0x400000;
        }
        sVar8 = sVar8 + *(short *)(lVar5 + 0x16);
      }
    } while (((uVar2 & 0x10) != 0) &&
            (bVar9 = (ulong)bVar1 * 0x70 + -0x70 != lVar7, lVar7 = lVar7 + 0x70, bVar9));
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void whereCheckIfBloomFilterIsUseful(
  const WhereInfo *pWInfo
){
  int i;
  LogEst nSearch = 0;

  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_BloomFilter) );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLoop *pLoop = pWInfo->a[i].pWLoop;
    const unsigned int reqFlags = (WHERE_SELFCULL|WHERE_COLUMN_EQ);
    SrcItem *pItem = &pWInfo->pTabList->a[pLoop->iTab];
    Table *pTab = pItem->pSTab;
    if( (pTab->tabFlags & TF_HasStat1)==0 ) break;
    pTab->tabFlags |= TF_MaybeReanalyze;
    if( i>=1
     && (pLoop->wsFlags & reqFlags)==reqFlags
     /* vvvvvv--- Always the case if WHERE_COLUMN_EQ is defined */
     && ALWAYS((pLoop->wsFlags & (WHERE_IPK|WHERE_INDEXED))!=0)
    ){
      if( nSearch > pTab->nRowLogEst ){
        testcase( pItem->fg.jointype & JT_LEFT );
        pLoop->wsFlags |= WHERE_BLOOMFILTER;
        pLoop->wsFlags &= ~WHERE_IDX_ONLY;
        WHERETRACE(0xffffffff, (
           "-> use Bloom-filter on loop %c because there are ~%.1e "
           "lookups into %s which has only ~%.1e rows\n",
           pLoop->cId, (double)sqlite3LogEstToInt(nSearch), pTab->zName,
           (double)sqlite3LogEstToInt(pTab->nRowLogEst)));
      }
    }
    nSearch += pLoop->nOut;
  }
}